

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O1

int h264_cabac_bypass(bitstream *str,h264_cabac_context *cabac,uint32_t *binVal)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t tmp;
  uint local_1c;
  
  uVar3 = cabac->codIOffset * 2;
  cabac->codIOffset = uVar3;
  if (str->dir == VS_ENCODE) {
    if (*binVal != 0) {
      cabac->codIOffset = uVar3 + cabac->codIRange;
    }
    uVar1 = cabac->codIOffset;
    if (0x1ff < uVar1) {
      if (uVar1 < 0x400) {
        cabac->bitsOutstanding = cabac->bitsOutstanding + 1;
        uVar3 = uVar1 - 0x200;
      }
      else {
        iVar2 = put_bit(str,cabac,1);
        if (iVar2 != 0) {
          return 1;
        }
        uVar3 = cabac->codIOffset - 0x400;
      }
      cabac->codIOffset = uVar3;
      goto LAB_00107d52;
    }
    iVar2 = put_bit(str,cabac,0);
  }
  else {
    iVar2 = vs_u(str,&local_1c,1);
    if (iVar2 != 0) {
      return 1;
    }
    local_1c = cabac->codIOffset | local_1c;
    cabac->codIOffset = local_1c;
    iVar2 = 0;
    if (local_1c < cabac->codIRange) {
      *binVal = 0;
    }
    else {
      *binVal = 1;
      cabac->codIOffset = cabac->codIOffset - cabac->codIRange;
    }
  }
  if (iVar2 != 0) {
    return 1;
  }
LAB_00107d52:
  cabac->BinCount = cabac->BinCount + 1;
  return 0;
}

Assistant:

int h264_cabac_bypass(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *binVal) {
	cabac->codIOffset <<= 1;
	if (str->dir == VS_ENCODE) {
		if (*binVal)
			cabac->codIOffset += cabac->codIRange;
		if (cabac->codIOffset < 512) {
			if (put_bit(str, cabac, 0))
				return 1;
		} else if (cabac->codIOffset >= 1024) {
			if (put_bit(str, cabac, 1))
				return 1;
			cabac->codIOffset -= 1024;
		} else {
			cabac->bitsOutstanding++;
			cabac->codIOffset -= 512;
		}
	} else {
		uint32_t tmp;
		if (vs_u(str, &tmp, 1))
			return 1;
		cabac->codIOffset |= tmp;
		if (cabac->codIOffset >= cabac->codIRange) {
			*binVal = 1;
			cabac->codIOffset -= cabac->codIRange;
		} else {
			*binVal = 0;
		}
	}
	cabac->BinCount++;
	return 0;
}